

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int mllr_mat(float32 *****out_A,float32 ****out_B,char *var_fn,vector_t ***mean,vector_t ***wt_mean,
            float32 ***wt_dcount,uint32 gau_begin,int32 *cb2mllr,uint32 mllr_mult,uint32 mllr_add,
            float32 varfloor,uint32 n_mgau,uint32 n_stream,uint32 n_density,uint32 n_mllr_class,
            uint32 *veclen)

{
  size_t d2;
  uint uVar1;
  vector_t *ppfVar2;
  vector_t pfVar3;
  float32 **ppfVar4;
  float32 **ppfVar5;
  float32 *pfVar6;
  float32 *pfVar7;
  float32 *****regl;
  int iVar8;
  int32 iVar9;
  cmd_ln_t *cmdln;
  long lVar10;
  float32 ****ppppfVar11;
  float32 ***pppfVar12;
  float32 **ppfVar13;
  char *fmt;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t d1;
  vector_t pfVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  uint32 n_mgau_rd;
  uint32 *veclen_rd;
  float32 *****local_108;
  ulong local_100;
  vector_t ***var;
  ulong local_f0;
  float32 ****local_e8;
  ulong local_e0;
  ulong local_d8;
  float32 ***local_d0;
  vector_t ***local_c8;
  vector_t ***local_c0;
  float32 *local_b8;
  vector_t ****fullvar;
  float32 ***B;
  float32 ****A;
  float32 ****local_98;
  float32 *****local_90;
  ulong local_88;
  long local_80;
  vector_t ***local_78;
  ulong local_70;
  ulong local_68;
  float32 ***local_60;
  float32 **local_58;
  float32 ***local_50;
  float32 ***local_48;
  vector_t local_40;
  vector_t local_38;
  
  local_108 = (float32 *****)CONCAT44(local_108._4_4_,varfloor);
  var = (vector_t ***)0x0;
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  veclen_rd = (uint32 *)0x0;
  local_d0 = wt_dcount;
  local_c8 = mean;
  local_c0 = wt_mean;
  local_90 = out_A;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x7f,"\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x80," ---- mllr_solve(): Conventional MLLR method\n");
  cmdln = cmd_ln_get();
  lVar10 = cmd_ln_int_r(cmdln,"-fullvar");
  if ((int)lVar10 == 0) {
    iVar8 = s3gau_read(var_fn,&var,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar8 != 0) {
      lVar10 = 0xa3;
      goto LAB_001031c3;
    }
  }
  else {
    iVar8 = s3gau_read_full(var_fn,&fullvar,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar8 != 0) {
      lVar10 = 0x8e;
LAB_001031c3:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,lVar10,"Couldn\'t read %s",var_fn);
      goto LAB_0010310f;
    }
    var = gauden_alloc_param(n_mgau_rd,n_stream_rd,n_density_rd,veclen_rd);
    if ((ulong)n_mgau_rd != 0) {
      uVar17 = 0;
      do {
        if ((ulong)n_stream_rd != 0) {
          uVar19 = 0;
          do {
            if ((ulong)n_density_rd != 0) {
              uVar1 = veclen_rd[uVar19];
              uVar14 = 0;
              do {
                if ((ulong)uVar1 != 0) {
                  ppfVar2 = fullvar[uVar17][uVar19][uVar14];
                  pfVar3 = var[uVar17][uVar19][uVar14];
                  uVar21 = 0;
                  do {
                    pfVar3[uVar21] = ppfVar2[uVar21][uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar1 != uVar21);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != n_density_rd);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != n_stream_rd);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != n_mgau_rd);
    }
    gauden_free_param_full(fullvar);
  }
  if (n_mgau_rd == n_mgau) {
    if (n_stream_rd == n_stream) {
      if (n_density_rd == n_density) {
        uVar17 = (ulong)n_stream;
        if (n_stream != 0) {
          lVar10 = 0;
          do {
            if (veclen[lVar10] != veclen_rd[lVar10]) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                      ,0xb3,"vector length of stream %u (== %u) != prior length (== %u)\n",lVar10,
                      (ulong)veclen_rd[lVar10],(ulong)veclen[lVar10]);
              goto LAB_0010310f;
            }
            lVar10 = lVar10 + 1;
          } while (n_stream != (uint32)lVar10);
        }
        local_98 = out_B;
        ckd_free(veclen_rd);
        veclen_rd = (uint32 *)0x0;
        local_88 = (ulong)n_mgau;
        local_70 = (ulong)n_density;
        if (n_mgau != 0) {
          uVar19 = 0;
          do {
            if (n_stream != 0) {
              uVar14 = 0;
              do {
                if (n_density != 0) {
                  uVar1 = veclen[uVar14];
                  uVar21 = 0;
                  do {
                    if ((ulong)uVar1 != 0) {
                      pfVar3 = var[uVar19][uVar14][uVar21];
                      uVar20 = 0;
                      do {
                        fVar23 = pfVar3[uVar20];
                        fVar25 = 0.5;
                        if ((0.0 < fVar23) &&
                           (fVar25 = 1.0 / local_108._0_4_, local_108._0_4_ <= fVar23)) {
                          fVar25 = 1.0 / fVar23;
                        }
                        pfVar3[uVar20] = fVar25;
                        uVar20 = uVar20 + 1;
                      } while (uVar1 != uVar20);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != local_70);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar17);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_88);
        }
        fputc(10,_stderr);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd0," ---- A. Accum regl, regr\n");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd1," No classes %d, no. stream %d\n",(ulong)n_mllr_class,(ulong)n_stream);
        uVar19 = (ulong)n_mllr_class;
        local_108 = (float32 *****)
                    __ckd_calloc_2d__(uVar19,uVar17,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                      ,0xd4);
        local_d8 = uVar19;
        ppppfVar11 = (float32 ****)
                     __ckd_calloc_2d__(uVar19,uVar17,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                       ,0xd6);
        local_f0 = uVar17;
        local_e8 = ppppfVar11;
        if (n_mllr_class != 0) {
          uVar17 = 0;
          do {
            if (n_stream != 0) {
              uVar19 = 0;
              do {
                d1 = (size_t)(int)veclen[uVar19];
                d2 = d1 + 1;
                pppfVar12 = (float32 ***)
                            __ckd_calloc_3d__(d1,d2,d2,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                              ,0xdb);
                local_108[uVar17][uVar19] = pppfVar12;
                ppfVar13 = (float32 **)
                           __ckd_calloc_2d__(d1,d2,4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                             ,0xdc);
                ppppfVar11[uVar17][uVar19] = ppfVar13;
                uVar19 = uVar19 + 1;
              } while (local_f0 != uVar19);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_d8);
        }
        if (gau_begin < n_mgau) {
          uVar17 = (ulong)gau_begin;
          do {
            local_e0 = uVar17;
            local_80 = (long)cb2mllr[local_e0];
            if (-1 < local_80 && n_stream != 0) {
              local_100 = 0;
              do {
                if (n_density != 0) {
                  uVar1 = veclen[local_100];
                  local_b8 = local_d0[local_e0][local_100];
                  local_78 = var;
                  local_68 = (ulong)uVar1;
                  uVar17 = 0;
                  do {
                    if ((0.0 < (float)local_b8[uVar17]) && (uVar1 != 0)) {
                      pfVar3 = local_c8[local_e0][local_100][uVar17];
                      local_38 = local_c0[local_e0][local_100][uVar17];
                      local_40 = var[local_e0][local_100][uVar17];
                      local_48 = local_108[local_80][local_100];
                      local_50 = local_108[local_80][local_100];
                      local_58 = local_e8[local_80][local_100];
                      local_60 = local_108[local_80][local_100];
                      ppfVar13 = local_e8[local_80][local_100];
                      uVar19 = 0;
                      do {
                        fVar23 = local_38[uVar19] * local_40[uVar19];
                        fVar25 = local_40[uVar19] * (float)local_b8[uVar17];
                        ppfVar4 = local_48[uVar19];
                        ppfVar5 = local_50[uVar19];
                        pfVar6 = local_58[uVar19];
                        lVar10 = 0;
                        uVar21 = 0;
                        uVar14 = (ulong)uVar1;
                        pfVar22 = pfVar3;
                        do {
                          fVar24 = pfVar3[uVar21] * fVar25;
                          pfVar7 = ppfVar4[uVar21];
                          uVar20 = 0;
                          do {
                            *(float *)((long)pfVar7 + uVar20 * 4 + lVar10) =
                                 pfVar22[uVar20] * fVar24 +
                                 *(float *)((long)pfVar7 + uVar20 * 4 + lVar10);
                            uVar20 = uVar20 + 1;
                          } while (uVar14 != uVar20);
                          ppfVar5[uVar21][(int)uVar1] =
                               (float32)(fVar24 + (float)ppfVar5[uVar21][(int)uVar1]);
                          pfVar6[uVar21] =
                               (float32)(pfVar3[uVar21] * fVar23 + (float)pfVar6[uVar21]);
                          uVar21 = uVar21 + 1;
                          pfVar22 = pfVar22 + 1;
                          lVar10 = lVar10 + 4;
                          uVar14 = uVar14 - 1;
                        } while (uVar21 != uVar1);
                        local_60[uVar19][(int)uVar1][(int)uVar1] =
                             (float32)(fVar25 + (float)local_60[uVar19][(int)uVar1][(int)uVar1]);
                        ppfVar13[uVar19][(int)uVar1] =
                             (float32)(fVar23 + (float)ppfVar13[uVar19][(int)uVar1]);
                        uVar19 = uVar19 + 1;
                      } while (uVar19 != local_68);
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != local_70);
                }
                local_100 = local_100 + 1;
              } while (local_100 != local_f0);
            }
            uVar17 = local_e0 + 1;
          } while (local_e0 + 1 != local_88);
        }
        gauden_free_param(local_c8);
        gauden_free_param(local_c0);
        ckd_free_3d(local_d0);
        if (n_mllr_class != 0) {
          uVar17 = 0;
          do {
            if (n_stream != 0) {
              uVar19 = 0;
              do {
                uVar1 = veclen[uVar19];
                uVar14 = (ulong)uVar1;
                if (uVar14 != 0) {
                  uVar21 = 0;
                  do {
                    uVar20 = 0;
                    do {
                      uVar18 = uVar20 + 1;
                      if (uVar20 < uVar14) {
                        ppfVar13 = local_108[uVar17][uVar19][uVar21];
                        pfVar6 = ppfVar13[uVar20];
                        uVar16 = uVar18 & 0xffffffff;
                        do {
                          ppfVar13[uVar16][uVar20] = pfVar6[uVar16];
                          uVar15 = (int)uVar16 + 1;
                          uVar16 = (ulong)uVar15;
                        } while (uVar15 <= uVar1);
                      }
                      uVar20 = uVar18;
                    } while (uVar18 != uVar1 + 1 + (uint)(uVar1 == 0xffffffff));
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar14);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != local_f0);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_d8);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x119," ---- B. Compute MLLR matrices (A,B)\n");
        ppppfVar11 = local_e8;
        regl = local_108;
        iVar9 = compute_mllr(local_108,local_e8,veclen,n_mllr_class,n_stream,mllr_mult,mllr_add,&A,
                             &B);
        if (iVar9 == 0) {
          free_mllr_reg(regl,ppppfVar11,n_mllr_class,n_stream);
          *local_90 = A;
          *local_98 = B;
          return 0;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x123,"MLLR computation failed\n");
        goto LAB_0010310f;
      }
      fmt = "n_density mismatch (%u : %u)\n";
      lVar10 = 0xae;
      uVar17 = (ulong)n_density;
    }
    else {
      fmt = "n_stream mismatch (%u : %u)\n";
      lVar10 = 0xab;
      uVar17 = (ulong)n_stream;
    }
  }
  else {
    fmt = "n_mgau mismatch (%u : %u)\n";
    lVar10 = 0xa8;
    uVar17 = (ulong)n_mgau;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,lVar10,fmt,uVar17);
LAB_0010310f:
  exit(1);
}

Assistant:

int 
mllr_mat(float32 	*****out_A, 
      	float32 	****out_B, 
  	const char 	*var_fn, 
  	vector_t 	***mean, 
        vector_t        ***wt_mean,             /* read from bw accum */
	float32         ***wt_dcount,           /* read from bw accum */
  	uint32 		gau_begin, 
  	int32 		*cb2mllr, 
  	uint32 		mllr_mult,		
  	uint32 		mllr_add,		
  	float32		varfloor, 
  	uint32 		n_mgau, 
  	uint32 		n_stream, 
  	uint32 		n_density, 
  	uint32 		n_mllr_class, 
  	const uint32 	*veclen) 


{
      vector_t 	***var  	= NULL; 
      float32 	****A  		= NULL;		
      float32 	***B   		= NULL; 	

      float32 	*****regl  	= NULL; 
      float32 	****regr   	= NULL; 

      float32     wt_mean_var;
      float32     wt_dcount_var;
      float32     wt_dcount_var_mean;

      float32	*tmean		= NULL; 
      uint32 	n_mgau_rd; 
      uint32 	n_stream_rd; 
      uint32 	n_density_rd; 

      uint32    *veclen_rd	= NULL; 

      uint32 i, j, k, l, s, p , q;
      int32 m, mc;
      int32 len=0;

      /*      uint32 	i, j, k, l, p, q, s; 
	      int32	m, mc, mi; */

      E_INFO("\n");
      E_INFO(" ---- mllr_solve(): Conventional MLLR method\n"); 

      if (cmd_ln_int32("-fullvar")) {
	  /* Extract diagonals to solve MLLR (we are not doing
	     variance adaptation, yet) */
	  vector_t ****fullvar;
	  uint32 i, j, k, l;

	  if (s3gau_read_full(var_fn, 
			      &fullvar, 
			      &n_mgau_rd, 
			      &n_stream_rd, 
			      &n_density_rd, 
			      &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
	  var = gauden_alloc_param(n_mgau_rd,
				   n_stream_rd,
				   n_density_rd,
				   veclen_rd);
	  for (i = 0; i < n_mgau_rd; ++i)
	      for (j = 0; j < n_stream_rd; ++j)
		  for (k = 0; k < n_density_rd; ++k)
		      for (l = 0; l < veclen_rd[j]; ++l)
			  var[i][j][k][l] =
			      fullvar[i][j][k][l][l];
	  gauden_free_param_full(fullvar);
      }
      else {
	  if (s3gau_read(var_fn, 
			 &var, 
			 &n_mgau_rd, 
			 &n_stream_rd, 
			 &n_density_rd, 
			 &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
      }

      if (n_mgau != n_mgau_rd) { 
  	E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd); 
      } 
      if (n_stream != n_stream_rd) { 
  	E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd); 
      } 
      if (n_density != n_density_rd) { 
  	E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd); 
      } 
      for (s = 0; s < n_stream; s++) { 
  	if (veclen[s] != veclen_rd[s]) { 
  	    E_FATAL("vector length of stream %u (== %u) " 
  		    "!= prior length (== %u)\n", s, veclen_rd[s], veclen[s]); 
  	} 
      } 
      ckd_free((void *)veclen_rd); 
      veclen_rd = NULL; 


      /* Invert variances. */
      for (i = 0; i < n_mgau; i++) { 
          for (j = 0; j < n_stream; j++) { 
              for (k = 0; k < n_density; k++) { 
                  for (l = 0; l < veclen[j]; l++) { 
                      if (var[i][j][k][l] <= 0.) { 
  			var[i][j][k][l] = VAR_CONST;	
  		    } 
  		    else if (var[i][j][k][l] < varfloor) { 
  			var[i][j][k][l] = 1. / varfloor; 
  		    } 
  		    else { 
  		        var[i][j][k][l] = 1. / var[i][j][k][l]; 
  		    } 
                  } 
              } 
          } 
      } 


      fprintf(stderr,"\n"); 

      E_INFO(" ---- A. Accum regl, regr\n"); 
      E_INFO(" No classes %d, no. stream %d\n",n_mllr_class,n_stream);

      /* Legetter's set of G matrices, one per dimension per class. */
      regl = (float32 *****)ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 ***)); 
      /* Legetter's Z matrices, one per class. */
      regr = (float32 ****) ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 **)); 
      
      for (i = 0; i < n_mllr_class; i++) { 
          for (j = 0; j < n_stream; j++) { 
              len = veclen[j]; 
              regl[i][j] = (float32 ***)ckd_calloc_3d(len, len+1, len+1, sizeof(float32)); 
              regr[i][j] = (float32 **) ckd_calloc_2d(len, len+1, sizeof(float32)); 
          } 
      } 
      
      /*      E_INFO(" Checking\n");*/

      for (i = gau_begin; i < n_mgau; i++) { 
        mc = cb2mllr[i]; 
	if (mc < 0) continue;	/* skip */

        for (j = 0; j < n_stream; j++) { 
	  len=veclen[j];

	  for (k = 0; k < n_density; k++) { 
	    if (wt_dcount[i][j][k] > 0.) { 
	      tmean = mean[i][j][k]; 
	      for (l = 0; l < len; l++) { 
		wt_mean_var   = wt_mean[i][j][k][l] * var[i][j][k][l]; 
		wt_dcount_var = wt_dcount[i][j][k]  * var[i][j][k][l]; 
		
		for (p = 0; p < len; p++) { 
		  wt_dcount_var_mean = wt_dcount_var * tmean[p]; 
		  for (q = p; q < len; q++) { 
		    /* This is g(l)_{pq} = sum_r(v_{ii}(r) d_{pq}(r))*/
		    /* or in other words sum(likelihood * invvar * outer(mean, mean)) */
		    regl[mc][j][l][p][q] += (float32) (wt_dcount_var_mean * tmean[q]); 
		  } 
		  /* G corresponding to extended element of q. */
		  regl[mc][j][l][p][len] += (float32)(wt_dcount_var_mean); 
		  /* This is z_{lp} = sum(likelihood * invvar * obs * mean_p) */
		  regr[mc][j][l][p] += (float32)(wt_mean_var * tmean[p]); 
		} 
		/* G corresponding to extended element of p and q. */
		/* Question: what about regl[mc][j][l][len][0..len]? */
		/* Answer: G(l) is symmetric, so we already calculated them. */
		regl[mc][j][l][len][len] += (float32)wt_dcount_var; 
		/* Z corresponding to extended element of p. */
		regr[mc][j][l][len] += (float32)(wt_mean_var); 
	      } 
	    } 
	  } 
	} 
      }

      gauden_free_param(mean); 
      gauden_free_param(wt_mean); 
      ckd_free_3d((void ***)wt_dcount); 

      /* Fill in the lower triangular part of regl. */
      for (m = 0; m < n_mllr_class; m++) { 
        for (j = 0; j < n_stream; j++) { 
	  for (l = 0; l < veclen[j]; l++) { 
	    for (p = 0; p <= veclen[j]; p++) { 
	      for (q = p+1; q <= veclen[j]; q++) { 
		regl[m][j][l][q][p] = regl[m][j][l][p][q]; 
	      } 
	    } 
	  } 
        } 
      } 

      E_INFO(" ---- B. Compute MLLR matrices (A,B)\n"); 
      if(compute_mllr(regl, 
  		    regr, 
  		    veclen, 
  		    n_mllr_class, 
  		    n_stream, 
  		    mllr_mult, 
  		    mllr_add, 
  		    &A, 
  		    &B) != S3_SUCCESS) {  
  	E_FATAL("MLLR computation failed\n"); 
      } 

      free_mllr_reg(regl,regr, n_mllr_class, n_stream); 

      *out_A = A; 
      *out_B = B; 

      return S3_SUCCESS; 
}